

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O2

void __thiscall jbcoin::openssl::secp256k1_data::secp256k1_data(secp256k1_data *this)

{
  bignum *this_00;
  BIGNUM *pBVar1;
  EC_GROUP *pEVar2;
  bn_ctx ctx;
  bignum local_38;
  string local_30;
  
  this_00 = &this->order;
  bignum::bignum(this_00);
  pEVar2 = EC_GROUP_new_by_curve_name(0x2ca);
  this->group = (EC_GROUP *)pEVar2;
  if (pEVar2 != (EC_GROUP *)0x0) {
    bn_ctx::bn_ctx((bn_ctx *)&local_30);
    get_order((openssl *)&local_38,this->group,(bn_ctx *)&local_30);
    pBVar1 = this_00->ptr;
    this_00->ptr = local_38.ptr;
    local_38.ptr = pBVar1;
    bignum::~bignum(&local_38);
    bn_ctx::~bn_ctx((bn_ctx *)&local_30);
    return;
  }
  std::__cxx11::string::string
            ((string *)&local_30,"The OpenSSL library on this system lacks elliptic curve support.",
             (allocator *)&local_38);
  LogicError(&local_30);
}

Assistant:

secp256k1_data ()
    {
        group = EC_GROUP_new_by_curve_name (NID_secp256k1);

        if (!group)
            LogicError ("The OpenSSL library on this system lacks elliptic curve support.");

        bn_ctx ctx;
        order = get_order (group, ctx);
    }